

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

FT_Int ps_tofixedarray(FT_Byte **acur,FT_Byte *limit,FT_Int max_values,FT_Fixed *values,
                      FT_Int power_ten)

{
  FT_Byte *pFVar1;
  FT_Byte *pFVar2;
  FT_Byte **local_60;
  FT_Byte *old_cur;
  FT_Fixed dummy;
  FT_Byte ender;
  FT_Byte c;
  FT_Byte *pFStack_38;
  FT_Int count;
  FT_Byte *cur;
  FT_Fixed *pFStack_28;
  FT_Int power_ten_local;
  FT_Fixed *values_local;
  FT_Byte *pFStack_18;
  FT_Int max_values_local;
  FT_Byte *limit_local;
  FT_Byte **acur_local;
  
  pFStack_38 = *acur;
  dummy._4_4_ = 0;
  limit_local = (FT_Byte *)acur;
  if (pFStack_38 < limit) {
    dummy._3_1_ = *pFStack_38;
    dummy._2_1_ = '\0';
    if (dummy._3_1_ == '[') {
      dummy._2_1_ = ']';
    }
    else if (dummy._3_1_ == '{') {
      dummy._2_1_ = '}';
    }
    cur._4_4_ = power_ten;
    pFStack_28 = values;
    values_local._4_4_ = max_values;
    pFStack_18 = limit;
    if (dummy._2_1_ != '\0') {
      pFStack_38 = pFStack_38 + 1;
    }
    do {
      if ((pFStack_18 <= pFStack_38) ||
         (skip_spaces(&stack0xffffffffffffffc8,pFStack_18), pFVar1 = pFStack_38,
         pFStack_18 <= pFStack_38)) break;
      if (*pFStack_38 == dummy._2_1_) {
        pFStack_38 = pFStack_38 + 1;
        break;
      }
      if ((pFStack_28 != (FT_Fixed *)0x0) && (values_local._4_4_ <= dummy._4_4_)) break;
      pFVar2 = (FT_Byte *)PS_Conv_ToFixed(&stack0xffffffffffffffc8,pFStack_18,(long)cur._4_4_);
      if (pFStack_28 == (FT_Fixed *)0x0) {
        local_60 = &old_cur;
      }
      else {
        local_60 = (FT_Byte **)(pFStack_28 + dummy._4_4_);
      }
      *local_60 = pFVar2;
      if (pFVar1 == pFStack_38) {
        dummy._4_4_ = -1;
        break;
      }
      dummy._4_4_ = dummy._4_4_ + 1;
    } while (dummy._2_1_ != '\0');
  }
  *(FT_Byte **)limit_local = pFStack_38;
  return dummy._4_4_;
}

Assistant:

static FT_Int
  ps_tofixedarray( FT_Byte*  *acur,
                   FT_Byte*   limit,
                   FT_Int     max_values,
                   FT_Fixed*  values,
                   FT_Int     power_ten )
  {
    FT_Byte*  cur   = *acur;
    FT_Int    count = 0;
    FT_Byte   c, ender;


    if ( cur >= limit )
      goto Exit;

    /* Check for the beginning of an array.  Otherwise, only one number */
    /* will be read.                                                    */
    c     = *cur;
    ender = 0;

    if ( c == '[' )
      ender = ']';
    else if ( c == '{' )
      ender = '}';

    if ( ender )
      cur++;

    /* now, read the values */
    while ( cur < limit )
    {
      FT_Fixed  dummy;
      FT_Byte*  old_cur;


      /* skip whitespace in front of data */
      skip_spaces( &cur, limit );
      if ( cur >= limit )
        goto Exit;

      if ( *cur == ender )
      {
        cur++;
        break;
      }

      old_cur = cur;

      if ( values && count >= max_values )
        break;

      /* call PS_Conv_ToFixed() even if coords == NULL */
      /* to properly parse number at `cur'             */
      *( values ? &values[count] : &dummy ) =
        PS_Conv_ToFixed( &cur, limit, power_ten );

      if ( old_cur == cur )
      {
        count = -1;
        goto Exit;
      }
      else
        count++;

      if ( !ender )
        break;
    }

  Exit:
    *acur = cur;
    return count;
  }